

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

int __thiscall duckdb_re2::ByteMapBuilder::Recolor(ByteMapBuilder *this,int oldcolor)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  int newcolor;
  int local_10;
  int local_c;
  
  ppVar3 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar1 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)ppVar1 - (long)ppVar3;
  if (0 < (long)uVar6 >> 5) {
    ppVar2 = (pointer)((long)&ppVar3->first + (uVar6 & 0xffffffffffffffe0));
    lVar5 = ((long)uVar6 >> 5) + 1;
    ppVar4 = ppVar3 + 2;
    do {
      if ((ppVar4[-2].first == oldcolor) || (ppVar4[-2].second == oldcolor)) {
        ppVar4 = ppVar4 + -2;
        goto LAB_00490d38;
      }
      if ((ppVar4[-1].first == oldcolor) || (ppVar4[-1].second == oldcolor)) {
        ppVar4 = ppVar4 + -1;
        goto LAB_00490d38;
      }
      if ((ppVar4->first == oldcolor) || (ppVar4->second == oldcolor)) goto LAB_00490d38;
      if ((ppVar4[1].first == oldcolor) || (ppVar4[1].second == oldcolor)) {
        ppVar4 = ppVar4 + 1;
        goto LAB_00490d38;
      }
      lVar5 = lVar5 + -1;
      ppVar4 = ppVar4 + 4;
    } while (1 < lVar5);
    uVar6 = (long)ppVar1 - (long)ppVar2;
    ppVar3 = ppVar2;
  }
  lVar5 = (long)uVar6 >> 3;
  if (lVar5 == 1) {
LAB_00490d11:
    ppVar4 = ppVar1;
    if (ppVar3->second == oldcolor) {
      ppVar4 = ppVar3;
    }
    if (ppVar3->first == oldcolor) {
      ppVar4 = ppVar3;
    }
  }
  else if (lVar5 == 2) {
LAB_00490d04:
    ppVar4 = ppVar3;
    if ((ppVar3->first != oldcolor) && (ppVar3->second != oldcolor)) {
      ppVar3 = ppVar3 + 1;
      goto LAB_00490d11;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_00490d42;
    ppVar4 = ppVar3;
    if ((ppVar3->first != oldcolor) && (ppVar3->second != oldcolor)) {
      ppVar3 = ppVar3 + 1;
      goto LAB_00490d04;
    }
  }
LAB_00490d38:
  if (ppVar4 != ppVar1) {
    return ppVar4->second;
  }
LAB_00490d42:
  local_c = this->nextcolor_;
  this->nextcolor_ = local_c + 1;
  local_10 = oldcolor;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->colormap_,
             &local_10,&local_c);
  return local_c;
}

Assistant:

int ByteMapBuilder::Recolor(int oldcolor) {
  // Yes, this is a linear search. There can be at most 256
  // colors and there will typically be far fewer than that.
  // Also, we need to consider keys *and* values in order to
  // avoid recoloring a given range more than once per batch.
  std::vector<std::pair<int, int>>::const_iterator it =
      std::find_if(colormap_.begin(), colormap_.end(),
                   [=](const std::pair<int, int>& kv) -> bool {
                     return kv.first == oldcolor || kv.second == oldcolor;
                   });
  if (it != colormap_.end())
    return it->second;
  int newcolor = nextcolor_;
  nextcolor_++;
  colormap_.emplace_back(oldcolor, newcolor);
  return newcolor;
}